

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

type_conflict3 dlib::ser_helper::pack_int<unsigned_long_long>(unsigned_long_long item,ostream *out)

{
  undefined8 uVar1;
  char *pcVar2;
  long lVar3;
  long *in_RSI;
  ulong in_RDI;
  bool bVar4;
  streambuf *sbuf;
  uchar i;
  uchar size;
  uchar buf [9];
  byte local_23;
  byte local_22;
  byte local_21 [9];
  long *local_18;
  ulong local_10;
  
  local_22 = 8;
  local_23 = 1;
  local_10 = in_RDI;
  do {
    if (8 < local_23) {
LAB_003cdd57:
      local_18 = in_RSI;
      pcVar2 = (char *)std::ios::rdbuf();
      local_21[0] = local_22;
      lVar3 = std::streambuf::sputn(pcVar2,(long)local_21);
      bVar4 = lVar3 != (int)(local_22 + 1);
      if (bVar4) {
        uVar1 = *(undefined8 *)(*local_18 + -0x18);
        std::operator|(_S_eofbit,_S_badbit);
        std::ios::setstate((int)local_18 + (int)uVar1);
      }
      return bVar4;
    }
    local_21[local_23] = (byte)local_10;
    local_10 = local_10 >> 8;
    if (local_10 == 0) {
      local_22 = local_23;
      goto LAB_003cdd57;
    }
    local_23 = local_23 + 1;
  } while( true );
}

Assistant:

typename disable_if_c<std::numeric_limits<T>::is_signed,bool>::type pack_int (
            T item,
            std::ostream& out
        )
        /*!
            requires
                - T is an unsigned integral type
            ensures
                - if (no problems occur serializing item) then
                    - writes item to out
                    - returns false
                - else
                    - returns true
        !*/
        {
            COMPILE_TIME_ASSERT(sizeof(T) <= 8);
            unsigned char buf[9];
            unsigned char size = sizeof(T);

            for (unsigned char i = 1; i <= sizeof(T); ++i)
            {
                buf[i] = static_cast<unsigned char>(item&0xFF);                
                item >>= 8;
                if (item == 0) { size = i; break; }
            }

            std::streambuf* sbuf = out.rdbuf();
            buf[0] = size;
            if (sbuf->sputn(reinterpret_cast<char*>(buf),size+1) != size+1)
            {
                out.setstate(std::ios::eofbit | std::ios::badbit);
                return true;
            }

            return false;
        }